

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

void __thiscall
duckdb::BitStringAggOperation::
Combine<duckdb::BitAggState<unsigned_long>,duckdb::BitStringAggOperation>
          (BitStringAggOperation *this,BitAggState<unsigned_long> *source,
          BitAggState<unsigned_long> *target,AggregateInputData *param_3)

{
  unsigned_long uVar1;
  string_t input;
  
  if (*this == (BitStringAggOperation)0x1) {
    if (source->is_set != false) {
      Bit::BitwiseOr((bitstring_t *)(this + 8),&source->value,&source->value);
      return;
    }
    input.value.pointer.ptr = (char *)param_3;
    input.value._0_8_ = *(undefined8 *)(this + 0x10);
    Assign<duckdb::string_t,duckdb::BitAggState<unsigned_long>>
              ((BitStringAggOperation *)source,*(BitAggState<unsigned_long> **)(this + 8),input);
    source->is_set = true;
    uVar1 = *(unsigned_long *)(this + 0x20);
    source->min = *(unsigned_long *)(this + 0x18);
    source->max = uVar1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			return;
		}
		if (!target.is_set) {
			Assign(target, source.value);
			target.is_set = true;
			target.min = source.min;
			target.max = source.max;
		} else {
			Bit::BitwiseOr(source.value, target.value, target.value);
		}
	}